

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::GetIn6Addr(CNetAddr *this,in6_addr *pipv6Addr)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  value_type_conflict3 *__src;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RSI;
  long in_FS_OFFSET;
  CNetAddr *in_stack_ffffffffffffffb8;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffc8;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsIPv6(in_stack_ffffffffffffffb8);
  if (!bVar2) {
    bVar2 = IsCJDNS(in_stack_ffffffffffffffb8);
    if (!bVar2) {
      local_9 = false;
      goto LAB_0197f46c;
    }
  }
  sVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size(in_stack_ffffffffffffffc8);
  if (sVar3 != 0x10) {
    __assert_fail("sizeof(*pipv6Addr) == m_addr.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                  ,0x28b,"bool CNetAddr::GetIn6Addr(struct in6_addr *) const");
  }
  __src = prevector<16U,_unsigned_char,_unsigned_int,_int>::data(&in_stack_ffffffffffffffb8->m_addr)
  ;
  sVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size(in_RSI);
  memcpy(in_RSI,__src,(ulong)sVar3);
  local_9 = true;
LAB_0197f46c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::GetIn6Addr(struct in6_addr* pipv6Addr) const
{
    if (!IsIPv6() && !IsCJDNS()) {
        return false;
    }
    assert(sizeof(*pipv6Addr) == m_addr.size());
    memcpy(pipv6Addr, m_addr.data(), m_addr.size());
    return true;
}